

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O1

void embree::sphereIntersectFunc(RTCIntersectFunctionNArguments *args)

{
  float fVar1;
  int *piVar2;
  RTCRayHitN *pRVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if ((args->N == 1) && (piVar2 = args->valid, *piVar2 != 0)) {
    pRVar3 = args->rayhit;
    fVar1 = (float)args->primID;
    pfVar4 = (float *)((ulong)(uint)fVar1 * 0x30 + (long)args->geometryUserPtr);
    *piVar2 = 0;
    fVar6 = *(float *)(pRVar3 + 0x10);
    fVar15 = *(float *)(pRVar3 + 0x14);
    fVar14 = *(float *)(pRVar3 + 0x18);
    fVar5 = *(float *)pRVar3 - *pfVar4;
    fVar7 = *(float *)(pRVar3 + 4) - pfVar4[1];
    fVar8 = *(float *)(pRVar3 + 8) - pfVar4[2];
    fVar11 = fVar15 * fVar15;
    fVar12 = fVar14 * fVar14;
    fVar13 = *(float *)(pRVar3 + 0x1c) * *(float *)(pRVar3 + 0x1c);
    fVar16 = fVar11 + fVar6 * fVar6 + fVar12;
    fVar17 = fVar11 + fVar11 + fVar13;
    fVar12 = fVar11 + fVar12 + fVar12;
    fVar13 = fVar11 + fVar13 + fVar13;
    fVar15 = fVar14 * fVar8 + fVar15 * fVar7 + fVar6 * fVar5;
    fVar15 = fVar15 + fVar15;
    fVar6 = fVar15 * fVar15 +
            fVar16 * -4.0 *
            ((fVar8 * fVar8 + fVar7 * fVar7 + fVar5 * fVar5) - pfVar4[4] * pfVar4[4]);
    if (0.0 <= fVar6) {
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      auVar9._4_4_ = fVar17;
      auVar9._0_4_ = fVar16;
      auVar9._8_4_ = fVar12;
      auVar9._12_4_ = fVar13;
      auVar10._4_4_ = fVar17;
      auVar10._0_4_ = fVar16;
      auVar10._8_4_ = fVar12;
      auVar10._12_4_ = fVar13;
      auVar10 = rcpss(auVar9,auVar10);
      fVar14 = (2.0 - fVar16 * auVar10._0_4_) * auVar10._0_4_ * 0.5;
      fVar5 = (-fVar15 - fVar6) * fVar14;
      fVar14 = (fVar6 - fVar15) * fVar14;
      fVar6 = pfVar4[8];
      if ((*(float *)(pRVar3 + 0xc) <= fVar5 && fVar5 != *(float *)(pRVar3 + 0xc)) &&
         (fVar5 < *(float *)(pRVar3 + 0x20))) {
        fVar15 = *pfVar4;
        fVar7 = pfVar4[1];
        fVar8 = pfVar4[2];
        *(float *)(pRVar3 + 0x20) = fVar5;
        *(ulong *)(pRVar3 + 0x30) =
             CONCAT44((fVar5 * *(float *)(pRVar3 + 0x14) + *(float *)(pRVar3 + 4)) - fVar7,
                      (fVar5 * *(float *)(pRVar3 + 0x10) + *(float *)pRVar3) - fVar15);
        *(float *)(pRVar3 + 0x38) =
             (fVar5 * *(float *)(pRVar3 + 0x18) + *(float *)(pRVar3 + 8)) - fVar8;
        *(undefined8 *)(pRVar3 + 0x3c) = 0;
        *(float *)(pRVar3 + 0x44) = fVar1;
        *(float *)(pRVar3 + 0x48) = fVar6;
        *piVar2 = -1;
      }
      if ((*(float *)(pRVar3 + 0xc) <= fVar14 && fVar14 != *(float *)(pRVar3 + 0xc)) &&
         (fVar14 < *(float *)(pRVar3 + 0x20))) {
        fVar15 = *pfVar4;
        fVar5 = pfVar4[1];
        fVar7 = pfVar4[2];
        *(float *)(pRVar3 + 0x20) = fVar14;
        *(ulong *)(pRVar3 + 0x30) =
             CONCAT44((fVar14 * *(float *)(pRVar3 + 0x14) + *(float *)(pRVar3 + 4)) - fVar5,
                      (fVar14 * *(float *)(pRVar3 + 0x10) + *(float *)pRVar3) - fVar15);
        *(float *)(pRVar3 + 0x38) =
             (fVar14 * *(float *)(pRVar3 + 0x18) + *(float *)(pRVar3 + 8)) - fVar7;
        *(undefined8 *)(pRVar3 + 0x3c) = 0;
        *(float *)(pRVar3 + 0x44) = fVar1;
        *(float *)(pRVar3 + 0x48) = fVar6;
        *piVar2 = -1;
      }
    }
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void sphereIntersectFunc(const RTCIntersectFunctionNArguments* args)
{
  int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  Ray *ray = (Ray*)args->rayhit;
  RTCHit* hit = (RTCHit *)&ray->Ng.x;
  unsigned int primID = args->primID;

  if (args->N != 1)
    return;
  const Sphere* spheres = (const Sphere*)ptr;
  const Sphere& sphere = spheres[primID];

  if (!valid[0]) return;
  valid[0] = 0;

  const Vec3fa v = ray->org-sphere.p;
  const float A = dot(ray->dir,ray->dir);
  const float B = 2.0f*dot(v,ray->dir);
  const float C = dot(v,v) - sqr(sphere.r);
  const float D = B*B - 4.0f*A*C;
  if (D < 0.0f) return;
  const float Q = sqrt(D);
  const float rcpA = rcp(A);
  const float t0 = 0.5f*rcpA*(-B-Q);
  const float t1 = 0.5f*rcpA*(-B+Q);

  RTCHit potentialHit;
  potentialHit.u = 0.0f;
  potentialHit.v = 0.0f;
  potentialHit.geomID = sphere.geomID;
  potentialHit.primID = primID;
  if ((ray->tnear() < t0) & (t0 < ray->tfar))
  {
    const Vec3fa Ng = ray->org+t0*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;
    ray->tfar = t0;
    *hit = potentialHit;
    valid[0] = -1;
  }

  if ((ray->tnear() < t1) & (t1 < ray->tfar))
  {
    const Vec3fa Ng = ray->org+t1*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;
    ray->tfar = t1;
    *hit = potentialHit;
    valid[0] = -1;
  }
}